

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteHash
          (WrapperFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Descriptor *pDVar2;
  char *text;
  
  pDVar2 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  TVar1 = FieldDescriptor::type(*(FieldDescriptor **)(pDVar2 + 0x28));
  if (TVar1 == TYPE_FLOAT) {
    text = 
    "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n"
    ;
  }
  else {
    pDVar2 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
    TVar1 = FieldDescriptor::type(*(FieldDescriptor **)(pDVar2 + 0x28));
    text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
    if (TVar1 == TYPE_DOUBLE) {
      text = 
      "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n"
      ;
    }
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteHash(io::Printer* printer) {
  const char *text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n";
  }
  printer->Print(variables_, text);
}